

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall dg::SubgraphNode<dg::pta::PSNode>::isolate(SubgraphNode<dg::pta::PSNode> *this)

{
  PSNode *pPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  PSNode *n;
  _Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_68;
  pointer local_48;
  pointer local_40;
  PSNode *local_38;
  
  local_48 = (this->_predecessors).
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppPVar4 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppPVar4 != local_48) {
    pPVar1 = *ppPVar4;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = ppPVar4;
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_68,
               (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar4 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppPVar4 != ppPVar2; ppPVar4 = ppPVar4 + 1) {
      local_38 = *ppPVar4;
      if (local_38 == (PSNode *)0x0 || &local_38->super_SubgraphNode<dg::pta::PSNode> != this) {
        std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                  ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_68,
                   &local_38);
      }
    }
    ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppPVar4 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = ppPVar2;
    local_68._M_impl.super__Vector_impl_data._M_finish = ppPVar5;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar4;
    std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
              (&local_68);
    ppPVar4 = local_40 + 1;
  }
  local_48 = (this->_successors).
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppPVar4 = (this->_successors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppPVar4 != local_48) {
    pPVar1 = *ppPVar4;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = ppPVar4;
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_68,
               (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar4 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppPVar4 != ppPVar2; ppPVar4 = ppPVar4 + 1) {
      local_38 = *ppPVar4;
      if (local_38 == (PSNode *)0x0 || &local_38->super_SubgraphNode<dg::pta::PSNode> != this) {
        std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                  ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_68,
                   &local_38);
      }
    }
    ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppPVar4 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
    (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = ppPVar2;
    local_68._M_impl.super__Vector_impl_data._M_finish = ppPVar5;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar4;
    std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
              (&local_68);
    ppPVar4 = local_40 + 1;
  }
  ppPVar2 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar4 = (this->_predecessors).
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar4 != ppPVar2; ppPVar4 = ppPVar4 + 1) {
    pPVar1 = *ppPVar4;
    ppPVar3 = (this->_successors).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar5 = (this->_successors).
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppPVar5 != ppPVar3; ppPVar5 = ppPVar5 + 1) {
      addSuccessor(&pPVar1->super_SubgraphNode<dg::pta::PSNode>,*ppPVar5);
    }
  }
  ppPVar4 = (this->_successors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_successors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar4) {
    (this->_successors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar4;
  }
  ppPVar4 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_predecessors).
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar4) {
    (this->_predecessors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar4;
  }
  return;
}

Assistant:

void isolate() {
        // Remove this node from successors of the predecessors
        for (NodeT *pred : _predecessors) {
            std::vector<NodeT *> new_succs;
            new_succs.reserve(pred->_successors.size());

            for (NodeT *n : pred->_successors) {
                if (n != this)
                    new_succs.push_back(n);
            }

            new_succs.swap(pred->_successors);
        }

        // remove this nodes from successors' predecessors
        for (NodeT *succ : _successors) {
            std::vector<NodeT *> new_preds;
            new_preds.reserve(succ->_predecessors.size());

            for (NodeT *n : succ->_predecessors) {
                if (n != this)
                    new_preds.push_back(n);
            }

            new_preds.swap(succ->_predecessors);
        }

        // Take every predecessor and connect it to every successor.
        for (NodeT *pred : _predecessors) {
            for (NodeT *succ : _successors) {
                assert(succ != this && "Self-loop");
                pred->addSuccessor(succ);
            }
        }

        _successors.clear();
        _predecessors.clear();
    }